

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void * mwMalloc(size_t size,char *file,int line)

{
  mwData **__s;
  mwData *pmVar1;
  mwStat *pmVar2;
  size_t sVar3;
  long lVar4;
  int urgent;
  char *pcVar5;
  unsigned_long uVar6;
  mwData *p;
  ulong __size;
  ulong uVar7;
  
  pcVar5 = file;
  mwAutoInit();
  urgent = (int)pcVar5;
  if (mwTestAlways != 0) {
    urgent = line;
    mwTestNow(file,line,1);
  }
  uVar6 = mwCounter + 1;
  uVar7 = 0x10;
  if (mwDataSize != '\0') {
    uVar7 = 0x48;
  }
  __size = uVar7 + size;
  if (CARRY8(uVar7,size)) {
    mwCounter = uVar6;
    return (void *)0x0;
  }
  mwCounter = uVar6;
  if ((mwUseLimit == '\x01') && (mwAllocLimit < (long)(mwStatCurAlloc + size))) {
    pcVar5 = "limit fail: <%ld> %s(%d), %ld wanted %ld available\n";
    lVar4 = mwAllocLimit - mwStatCurAlloc;
  }
  else {
    pmVar1 = (mwData *)malloc(__size);
    if (pmVar1 != (mwData *)0x0) {
LAB_001070f6:
      pmVar1->count = uVar6;
      pmVar1->prev = (mwData *)0x0;
      pmVar1->next = mwHead;
      pmVar1->file = file;
      pmVar1->size = size;
      pmVar1->line = line;
      pmVar1->flag = 0;
      pmVar1->check = (long)line ^ size ^ uVar6 ^ 0xfe0180;
      if (mwHead != (mwData *)0x0) {
        mwHead->prev = pmVar1;
      }
      if (mwTail == (mwData *)0x0) {
        mwTail = pmVar1;
      }
      p = pmVar1 + 1;
      if (mwDataSize == '\0') {
        p = pmVar1;
      }
      mwHead = pmVar1;
      mwWriteOF(p);
      __s = &p->next;
      memset(__s,0xfe,size);
      mwWriteOF((void *)((long)&p->next + size));
      mwNumCurAlloc = mwNumCurAlloc + 1;
      mwStatTotAlloc = mwStatTotAlloc + size;
      mwStatCurAlloc = mwStatCurAlloc + size;
      if (mwStatMaxAlloc < mwStatCurAlloc) {
        mwStatMaxAlloc = mwStatCurAlloc;
      }
      mwStatNumAlloc = mwStatNumAlloc + 1;
      if (mwStatLevel == 0) {
        return __s;
      }
      pmVar2 = mwStatGet(file,-1,1);
      if (pmVar2 != (mwStat *)0x0) {
        lVar4 = pmVar2->curr + size;
        pmVar2->curr = lVar4;
        pmVar2->total = size + pmVar2->total;
        pmVar2->num = pmVar2->num + 1;
        if (pmVar2->max < lVar4) {
          pmVar2->max = lVar4;
        }
      }
      if (file == (char *)0x0) {
        return __s;
      }
      if (line == -1) {
        return __s;
      }
      if (mwStatLevel < 2) {
        return __s;
      }
      pmVar2 = mwStatGet(file,line,1);
      if (pmVar2 == (mwStat *)0x0) {
        return __s;
      }
      lVar4 = size + pmVar2->curr;
      pmVar2->curr = lVar4;
      pmVar2->total = size + pmVar2->total;
      pmVar2->num = pmVar2->num + 1;
      if (lVar4 <= pmVar2->max) {
        return __s;
      }
      pmVar2->max = lVar4;
      return __s;
    }
    sVar3 = mwFreeUp(__size,urgent);
    if (__size <= sVar3) {
      pmVar1 = (mwData *)malloc(__size);
      uVar6 = mwCounter;
      if (pmVar1 != (mwData *)0x0) goto LAB_001070f6;
      mwWrite("internal: mwFreeUp(%u) reported success, but malloc() fails\n",__size);
      mwIncErr();
      mwFlush();
    }
    pcVar5 = "fail: <%ld> %s(%d), %ld wanted %ld allocated\n";
    lVar4 = mwStatCurAlloc;
  }
  mwWrite(pcVar5,mwCounter,file,(ulong)(uint)line,size,lVar4);
  mwIncErr();
  mwFlush();
  return (void *)0x0;
}

Assistant:

void *mwMalloc(size_t size, const char *file, int line)
{
	size_t needed;
	mwData *mw;
	char *ptr;
	void *p;

	mwAutoInit();

	MW_MUTEX_LOCK();

	TESTS(file, line);

	mwCounter ++;
	needed = mwDataSize + mwOverflowZoneSize * 2 + size;
	if (needed < size) {
		/* theoretical case: req size + mw overhead exceeded size_t limits */
		return NULL;
	}

	/* if this allocation would violate the limit, fail it */
	if (mwUseLimit && ((long)size + mwStatCurAlloc > mwAllocLimit)) {
		mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",
				mwCounter, file, line, (long)size, mwAllocLimit - mwStatCurAlloc);
		mwIncErr();
		FLUSH();
		MW_MUTEX_UNLOCK();
		return NULL;
	}

	mw = (mwData *) malloc(needed);
	if (mw == NULL) {
		if (mwFreeUp(needed, 0) >= needed) {
			mw = (mwData *) malloc(needed);
			if (mw == NULL) {
				mwWrite("internal: mwFreeUp(%u) reported success, but malloc() fails\n", needed);
				mwIncErr();
				FLUSH();
			}
		}
		if (mw == NULL) {
			mwWrite("fail: <%ld> %s(%d), %ld wanted %ld allocated\n",
					mwCounter, file, line, (long)size, mwStatCurAlloc);
			mwIncErr();
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}
	}

	mw->count = mwCounter;
	mw->prev = NULL;
	mw->next = mwHead;
	mw->file = file;
	mw->size = size;
	mw->line = line;
	mw->flag = 0;
	mw->check = CHKVAL(mw);

	if (mwHead) {
		mwHead->prev = mw;
	}
	mwHead = mw;
	if (mwTail == NULL) {
		mwTail = mw;
	}

	ptr = ((char *)mw) + mwDataSize;
	mwWriteOF(ptr);   /* '*(long*)ptr = PRECHK;' */
	ptr += mwOverflowZoneSize;
	p = ptr;
	memset(ptr, MW_VAL_NEW, size);
	ptr += size;
	mwWriteOF(ptr);   /* '*(long*)ptr = POSTCHK;' */

	mwNumCurAlloc ++;
	mwStatCurAlloc += (long) size;
	mwStatTotAlloc += (long) size;
	if (mwStatCurAlloc > mwStatMaxAlloc) {
		mwStatMaxAlloc = mwStatCurAlloc;
	}
	mwStatNumAlloc ++;

	if (mwStatLevel) {
		mwStatAlloc(size, file, line);
	}

	MW_MUTEX_UNLOCK();
	return p;
}